

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  ImGuiWindow **ppIVar3;
  ImVec2 local_c8 [2];
  ImRect local_b8;
  ImRect local_a8;
  undefined1 local_98 [8];
  ImRect r_avoid_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImVec2 local_64;
  ImRect local_5c;
  undefined1 local_4c [8];
  ImRect r_avoid;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImRect r_outer;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImVec2 pos;
  
  r_outer.Max = (ImVec2)GImGui;
  _parent_window = GetWindowAllowedExtentRect(window);
  if ((window->Flags & 0x10000000U) == 0) {
    if ((window->Flags & 0x4000000U) == 0) {
      if ((window->Flags & 0x2000000U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                      ,0x1eeb,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      ref_pos.x = *(float *)((long)r_outer.Max + 0x160c);
      r_avoid_2.Max = NavCalcPreferredRefPos();
      ImRect::ImRect((ImRect *)local_98);
      if ((((*(byte *)((long)r_outer.Max + 0x1c36) & 1) == 0) &&
          ((*(byte *)((long)r_outer.Max + 0x1c37) & 1) != 0)) &&
         ((*(uint *)((long)r_outer.Max + 8) & 4) == 0)) {
        ImRect::ImRect(&local_a8,r_avoid_2.Max.x - 16.0,r_avoid_2.Max.y - 8.0,r_avoid_2.Max.x + 16.0
                       ,r_avoid_2.Max.y + 8.0);
        local_98._0_4_ = local_a8.Min.x;
        local_98._4_4_ = local_a8.Min.y;
        r_avoid_2.Min = local_a8.Max;
      }
      else {
        ImRect::ImRect(&local_b8,r_avoid_2.Max.x - 16.0,r_avoid_2.Max.y - 8.0,
                       ref_pos.x * 24.0 + r_avoid_2.Max.x,ref_pos.x * 24.0 + r_avoid_2.Max.y);
        local_98._0_4_ = local_b8.Min.x;
        local_98._4_4_ = local_b8.Min.y;
        r_avoid_2.Min = local_b8.Max;
      }
      window_local = (ImGuiWindow *)
                     FindBestWindowPosForPopupEx
                               (&r_avoid_2.Max,&window->Size,&window->AutoPosLastDirection,
                                (ImRect *)&parent_window,(ImRect *)local_98,
                                ImGuiPopupPositionPolicy_Default);
      if (window->AutoPosLastDirection == -1) {
        ImVec2::ImVec2(local_c8,2.0,2.0);
        window_local = (ImGuiWindow *)operator+(&r_avoid_2.Max,local_c8);
      }
    }
    else {
      fVar1 = (window->Pos).x;
      fVar2 = (window->Pos).y;
      ImRect::ImRect((ImRect *)&ref_pos.y,fVar1 - 1.0,fVar2 - 1.0,fVar1 + 1.0,fVar2 + 1.0);
      window_local = (ImGuiWindow *)
                     FindBestWindowPosForPopupEx
                               (&window->Pos,&window->Size,&window->AutoPosLastDirection,
                                (ImRect *)&parent_window,(ImRect *)&ref_pos.y,
                                ImGuiPopupPositionPolicy_Default);
    }
  }
  else {
    if (*(ImGuiWindow **)((long)r_outer.Max + 0x1a70) != window) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                    ,0x1ecd,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)((long)r_outer.Max + 0x1a48),
                         *(int *)((long)r_outer.Max + 0x1a48) + -2);
    unique0x00012000 = *ppIVar3;
    r_avoid.Max.x = *(float *)((long)r_outer.Max + 0x15b8);
    ImRect::ImRect((ImRect *)local_4c);
    if (((stack0xffffffffffffffc8->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect((ImRect *)&r_avoid_1.Max,(stack0xffffffffffffffc8->Pos).x + r_avoid.Max.x,
                     -3.4028235e+38,
                     (((stack0xffffffffffffffc8->Pos).x + (stack0xffffffffffffffc8->Size).x) -
                     r_avoid.Max.x) - (stack0xffffffffffffffc8->ScrollbarSizes).x,3.4028235e+38);
      local_4c._0_4_ = r_avoid_1.Max.x;
      local_4c._4_4_ = r_avoid_1.Max.y;
      r_avoid.Min = local_64;
    }
    else {
      ImRect::ImRect(&local_5c,-3.4028235e+38,(stack0xffffffffffffffc8->ClipRect).Min.y,
                     3.4028235e+38,(stack0xffffffffffffffc8->ClipRect).Max.y);
      local_4c._0_4_ = local_5c.Min.x;
      local_4c._4_4_ = local_5c.Min.y;
      r_avoid.Min = local_5c.Max;
    }
    window_local = (ImGuiWindow *)
                   FindBestWindowPosForPopupEx
                             (&window->Pos,&window->Size,&window->AutoPosLastDirection,
                              (ImRect *)&parent_window,(ImRect *)local_4c,
                              ImGuiPopupPositionPolicy_Default);
  }
  return (ImVec2)window_local;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}